

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall cmInstallExportGenerator::GenerateScript(cmInstallExportGenerator *this,ostream *os)

{
  cmExportInstallFileGenerator *pcVar1;
  bool bVar2;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_00;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  ulong uVar6;
  reference config;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  const_iterator ci;
  string local_1e0;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream e;
  ostream *os_local;
  cmInstallExportGenerator *this_local;
  
  this_00 = cmExportSet::GetTargetExports(this->ExportSet);
  bVar2 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::empty(this_00);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = std::operator<<((ostream *)local_190,"INSTALL(EXPORT) given unknown export \"");
    psVar4 = cmExportSet::GetName_abi_cxx11_(this->ExportSet);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,"\"");
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar5,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    ComputeTempDir(this);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar5);
    std::__cxx11::string::operator=((string *)&this->MainImportFile,(string *)&this->TempDir);
    std::__cxx11::string::operator+=((string *)&this->MainImportFile,"/");
    std::__cxx11::string::operator+=((string *)&this->MainImportFile,(string *)&this->FileName);
    pcVar1 = this->EFGen;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmExportFileGenerator::SetExportFile(&pcVar1->super_cmExportFileGenerator,pcVar5);
    cmExportFileGenerator::SetNamespace(&this->EFGen->super_cmExportFileGenerator,&this->Namespace);
    cmExportFileGenerator::SetExportOld
              (&this->EFGen->super_cmExportFileGenerator,(bool)(this->ExportOld & 1));
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes);
    if (bVar2) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        cmExportFileGenerator::AddConfiguration
                  (&this->EFGen->super_cmExportFileGenerator,
                   &(this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName);
      }
      else {
        pcVar1 = this->EFGen;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1e0,"",(allocator *)((long)&ci._M_current + 7));
        cmExportFileGenerator::AddConfiguration(&pcVar1->super_cmExportFileGenerator,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&ci._M_current + 7));
      }
    }
    else {
      local_1f0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes);
      while( true ) {
        local_1f8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes);
        bVar2 = __gnu_cxx::operator!=(&local_1f0,&local_1f8);
        if (!bVar2) break;
        pcVar1 = this->EFGen;
        config = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_1f0);
        cmExportFileGenerator::AddConfiguration(&pcVar1->super_cmExportFileGenerator,config);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1f0);
      }
    }
    cmExportFileGenerator::GenerateImportFile(&this->EFGen->super_cmExportFileGenerator);
    cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,os);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScript(std::ostream& os)
{
  // Skip empty sets.
  if(ExportSet->GetTargetExports()->empty())
    {
    std::ostringstream e;
    e << "INSTALL(EXPORT) given unknown export \""
      << ExportSet->GetName() << "\"";
    cmSystemTools::Error(e.str().c_str());
    return;
    }

  // Create the temporary directory in which to store the files.
  this->ComputeTempDir();
  cmSystemTools::MakeDirectory(this->TempDir.c_str());

  // Construct a temporary location for the file.
  this->MainImportFile = this->TempDir;
  this->MainImportFile += "/";
  this->MainImportFile += this->FileName;

  // Generate the import file for this export set.
  this->EFGen->SetExportFile(this->MainImportFile.c_str());
  this->EFGen->SetNamespace(this->Namespace);
  this->EFGen->SetExportOld(this->ExportOld);
  if(this->ConfigurationTypes->empty())
    {
    if(!this->ConfigurationName.empty())
      {
      this->EFGen->AddConfiguration(this->ConfigurationName);
      }
    else
      {
      this->EFGen->AddConfiguration("");
      }
    }
  else
    {
    for(std::vector<std::string>::const_iterator
          ci = this->ConfigurationTypes->begin();
        ci != this->ConfigurationTypes->end(); ++ci)
      {
      this->EFGen->AddConfiguration(*ci);
      }
    }
  this->EFGen->GenerateImportFile();

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}